

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock_sse.c
# Opt level: O2

void uavs3d_deblock_hor_luma_sse(pel *src,int stride,int alpha,int beta,int flt_flag)

{
  pel *ppVar1;
  pel *ppVar2;
  long lVar3;
  pel *ppVar4;
  int iVar5;
  pel *ppVar6;
  pel *ppVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short sVar11;
  short sVar12;
  undefined4 uVar13;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  undefined1 auVar14 [16];
  short sVar16;
  short sVar28;
  undefined1 auVar15 [16];
  short sVar29;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar53;
  short sVar60;
  short sVar62;
  short sVar64;
  short sVar66;
  short sVar68;
  short sVar70;
  undefined1 in_XMM3 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar72;
  undefined1 auVar58 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  short sVar93;
  short sVar94;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  undefined1 in_XMM7 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  short sVar112;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  short sVar113;
  short sVar114;
  short sVar115;
  undefined1 in_XMM9 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  short sVar118;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  undefined1 in_XMM10 [16];
  undefined1 auVar119 [16];
  short sVar127;
  undefined1 auVar120 [16];
  undefined1 auVar128 [16];
  short sVar129;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  short sVar137;
  undefined1 in_XMM12 [16];
  undefined1 auVar130 [16];
  short sVar138;
  undefined1 auVar131 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar139 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar143 [16];
  short sVar30;
  short sVar31;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar59;
  short sVar61;
  short sVar63;
  short sVar65;
  short sVar67;
  short sVar69;
  short sVar71;
  short sVar73;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  
  iVar5 = (flt_flag << 0x17) >> 0x1f;
  auVar9 = pshuflw(ZEXT416((uint)alpha),ZEXT416((uint)alpha),0);
  auVar14 = pshuflw(ZEXT416((uint)beta),ZEXT416((uint)beta),0);
  lVar3 = (long)(stride * 2);
  ppVar7 = src + -lVar3;
  lVar8 = (long)stride;
  ppVar2 = src + -lVar8;
  auVar95 = pmovzxbw(in_XMM7,*(undefined8 *)(src + -(long)(stride * 3)));
  auVar140 = pmovzxbw(in_XMM14,*(undefined8 *)ppVar7);
  auVar119 = pmovzxbw(in_XMM10,*(undefined8 *)ppVar2);
  auVar130 = pmovzxbw(in_XMM12,*(undefined8 *)src);
  auVar139 = pmovzxbw(in_XMM13,*(undefined8 *)(src + lVar8));
  auVar54 = pmovzxbw(in_XMM3,*(undefined8 *)(src + lVar3));
  uVar13 = auVar14._0_4_;
  auVar89._4_4_ = uVar13;
  auVar89._0_4_ = uVar13;
  auVar89._8_4_ = uVar13;
  auVar89._12_4_ = uVar13;
  auVar84._4_4_ = -(flt_flag & 1U);
  auVar84._0_4_ = -(flt_flag & 1U);
  auVar84._12_4_ = iVar5;
  auVar84._8_4_ = iVar5;
  sVar11 = auVar140._0_2_;
  sVar118 = auVar119._0_2_;
  auVar74._0_2_ = sVar11 - sVar118;
  sVar16 = auVar140._2_2_;
  sVar121 = auVar119._2_2_;
  auVar74._2_2_ = sVar16 - sVar121;
  sVar18 = auVar140._4_2_;
  sVar122 = auVar119._4_2_;
  auVar74._4_2_ = sVar18 - sVar122;
  sVar20 = auVar140._6_2_;
  sVar123 = auVar119._6_2_;
  auVar74._6_2_ = sVar20 - sVar123;
  sVar22 = auVar140._8_2_;
  sVar124 = auVar119._8_2_;
  auVar74._8_2_ = sVar22 - sVar124;
  sVar24 = auVar140._10_2_;
  sVar125 = auVar119._10_2_;
  auVar74._10_2_ = sVar24 - sVar125;
  sVar26 = auVar140._12_2_;
  sVar28 = auVar140._14_2_;
  sVar126 = auVar119._12_2_;
  auVar74._12_2_ = sVar26 - sVar126;
  sVar127 = auVar119._14_2_;
  auVar74._14_2_ = sVar28 - sVar127;
  auVar15 = pabsw(auVar74,auVar74);
  sVar30 = auVar139._0_2_;
  sVar129 = auVar130._0_2_;
  auVar32._0_2_ = sVar30 - sVar129;
  sVar38 = auVar139._2_2_;
  sVar132 = auVar130._2_2_;
  auVar32._2_2_ = sVar38 - sVar132;
  sVar40 = auVar139._4_2_;
  sVar133 = auVar130._4_2_;
  auVar32._4_2_ = sVar40 - sVar133;
  sVar42 = auVar139._6_2_;
  sVar134 = auVar130._6_2_;
  auVar32._6_2_ = sVar42 - sVar134;
  sVar44 = auVar139._8_2_;
  sVar135 = auVar130._8_2_;
  auVar32._8_2_ = sVar44 - sVar135;
  sVar46 = auVar139._10_2_;
  sVar136 = auVar130._10_2_;
  auVar32._10_2_ = sVar46 - sVar136;
  sVar48 = auVar139._12_2_;
  sVar50 = auVar139._14_2_;
  sVar137 = auVar130._12_2_;
  auVar32._12_2_ = sVar48 - sVar137;
  sVar138 = auVar130._14_2_;
  auVar32._14_2_ = sVar50 - sVar138;
  auVar74 = pabsw(in_XMM4,auVar32);
  sVar31 = auVar95._0_2_;
  auVar33._0_2_ = sVar31 - sVar118;
  sVar39 = auVar95._2_2_;
  auVar33._2_2_ = sVar39 - sVar121;
  sVar41 = auVar95._4_2_;
  auVar33._4_2_ = sVar41 - sVar122;
  sVar43 = auVar95._6_2_;
  auVar33._6_2_ = sVar43 - sVar123;
  sVar45 = auVar95._8_2_;
  auVar33._8_2_ = sVar45 - sVar124;
  sVar47 = auVar95._10_2_;
  auVar33._10_2_ = sVar47 - sVar125;
  sVar49 = auVar95._12_2_;
  sVar51 = auVar95._14_2_;
  auVar33._12_2_ = sVar49 - sVar126;
  auVar33._14_2_ = sVar51 - sVar127;
  auVar34 = pabsw(auVar33,auVar33);
  sVar52 = auVar54._0_2_;
  auVar55._0_2_ = sVar52 - sVar129;
  sVar59 = auVar54._2_2_;
  auVar55._2_2_ = sVar59 - sVar132;
  sVar61 = auVar54._4_2_;
  auVar55._4_2_ = sVar61 - sVar133;
  sVar63 = auVar54._6_2_;
  auVar55._6_2_ = sVar63 - sVar134;
  sVar65 = auVar54._8_2_;
  auVar55._8_2_ = sVar65 - sVar135;
  sVar67 = auVar54._10_2_;
  auVar55._10_2_ = sVar67 - sVar136;
  sVar69 = auVar54._12_2_;
  sVar71 = auVar54._14_2_;
  auVar55._12_2_ = sVar69 - sVar137;
  auVar55._14_2_ = sVar71 - sVar138;
  auVar56 = pabsw(auVar55,auVar55);
  sVar114 = auVar14._0_2_;
  sVar115 = auVar14._2_2_;
  auVar35._0_2_ = sVar118 - sVar129;
  auVar35._2_2_ = sVar121 - sVar132;
  auVar35._4_2_ = sVar122 - sVar133;
  auVar35._6_2_ = sVar123 - sVar134;
  auVar35._8_2_ = sVar124 - sVar135;
  auVar35._10_2_ = sVar125 - sVar136;
  auVar35._12_2_ = sVar126 - sVar137;
  auVar35._14_2_ = sVar127 - sVar138;
  auVar36 = pabsw(auVar35,auVar35);
  sVar94 = auVar9._0_2_;
  auVar14._0_2_ = -(ushort)(auVar36._0_2_ < sVar94);
  sVar101 = auVar9._2_2_;
  auVar14._2_2_ = -(ushort)(auVar36._2_2_ < sVar101);
  auVar14._4_2_ = -(ushort)(auVar36._4_2_ < sVar94);
  auVar14._6_2_ = -(ushort)(auVar36._6_2_ < sVar101);
  auVar14._8_2_ = -(ushort)(auVar36._8_2_ < sVar94);
  auVar14._10_2_ = -(ushort)(auVar36._10_2_ < sVar101);
  auVar14._12_2_ = -(ushort)(auVar36._12_2_ < sVar94);
  auVar14._14_2_ = -(ushort)(auVar36._14_2_ < sVar101);
  auVar116 = pmovsxbw(in_XMM9,0x202020202020202);
  sVar94 = auVar15._0_2_;
  auVar96._0_2_ = -(ushort)(sVar94 < sVar114);
  sVar101 = auVar15._2_2_;
  auVar96._2_2_ = -(ushort)(sVar101 < sVar115);
  sVar103 = auVar15._4_2_;
  auVar96._4_2_ = -(ushort)(sVar103 < sVar114);
  sVar105 = auVar15._6_2_;
  auVar96._6_2_ = -(ushort)(sVar105 < sVar115);
  sVar107 = auVar15._8_2_;
  auVar96._8_2_ = -(ushort)(sVar107 < sVar114);
  sVar109 = auVar15._10_2_;
  auVar96._10_2_ = -(ushort)(sVar109 < sVar115);
  sVar111 = auVar15._12_2_;
  auVar96._12_2_ = -(ushort)(sVar111 < sVar114);
  sVar113 = auVar15._14_2_;
  auVar96._14_2_ = -(ushort)(sVar113 < sVar115);
  auVar96 = auVar96 & auVar116;
  sVar93 = auVar96._0_2_ + (ushort)(auVar34._0_2_ < sVar114);
  sVar100 = auVar96._2_2_ + (ushort)(auVar34._2_2_ < sVar115);
  sVar102 = auVar96._4_2_ + (ushort)(auVar34._4_2_ < sVar114);
  sVar104 = auVar96._6_2_ + (ushort)(auVar34._6_2_ < sVar115);
  sVar106 = auVar96._8_2_ + (ushort)(auVar34._8_2_ < sVar114);
  sVar108 = auVar96._10_2_ + (ushort)(auVar34._10_2_ < sVar115);
  sVar110 = auVar96._12_2_ + (ushort)(auVar34._12_2_ < sVar114);
  sVar112 = auVar96._14_2_ + (ushort)(auVar34._14_2_ < sVar115);
  sVar12 = auVar74._0_2_;
  auVar57._0_2_ = -(ushort)(sVar12 < sVar114);
  sVar17 = auVar74._2_2_;
  auVar57._2_2_ = -(ushort)(sVar17 < sVar115);
  sVar19 = auVar74._4_2_;
  auVar57._4_2_ = -(ushort)(sVar19 < sVar114);
  sVar21 = auVar74._6_2_;
  auVar57._6_2_ = -(ushort)(sVar21 < sVar115);
  sVar23 = auVar74._8_2_;
  auVar57._8_2_ = -(ushort)(sVar23 < sVar114);
  sVar25 = auVar74._10_2_;
  auVar57._10_2_ = -(ushort)(sVar25 < sVar115);
  sVar27 = auVar74._12_2_;
  auVar57._12_2_ = -(ushort)(sVar27 < sVar114);
  sVar29 = auVar74._14_2_;
  auVar57._14_2_ = -(ushort)(sVar29 < sVar115);
  auVar57 = auVar57 & auVar116;
  auVar15 = psraw(auVar89,2);
  sVar53 = auVar57._0_2_ + (ushort)(auVar56._0_2_ < sVar114) + sVar93;
  sVar60 = auVar57._2_2_ + (ushort)(auVar56._2_2_ < sVar115) + sVar100;
  sVar62 = auVar57._4_2_ + (ushort)(auVar56._4_2_ < sVar114) + sVar102;
  sVar64 = auVar57._6_2_ + (ushort)(auVar56._6_2_ < sVar115) + sVar104;
  sVar66 = auVar57._8_2_ + (ushort)(auVar56._8_2_ < sVar114) + sVar106;
  sVar68 = auVar57._10_2_ + (ushort)(auVar56._10_2_ < sVar115) + sVar108;
  sVar70 = auVar57._12_2_ + (ushort)(auVar56._12_2_ < sVar114) + sVar110;
  sVar72 = auVar57._14_2_ + (ushort)(auVar56._14_2_ < sVar115) + sVar112;
  auVar142._0_2_ =
       -(ushort)(auVar15._0_2_ <
                (short)((ushort)(sVar94 < sVar12) * sVar12 | (ushort)(sVar94 >= sVar12) * sVar94));
  auVar142._2_2_ =
       -(ushort)(auVar15._2_2_ <
                (short)((ushort)(sVar101 < sVar17) * sVar17 | (ushort)(sVar101 >= sVar17) * sVar101)
                );
  auVar142._4_2_ =
       -(ushort)(auVar15._4_2_ <
                (short)((ushort)(sVar103 < sVar19) * sVar19 | (ushort)(sVar103 >= sVar19) * sVar103)
                );
  auVar142._6_2_ =
       -(ushort)(auVar15._6_2_ <
                (short)((ushort)(sVar105 < sVar21) * sVar21 | (ushort)(sVar105 >= sVar21) * sVar105)
                );
  auVar142._8_2_ =
       -(ushort)(auVar15._8_2_ <
                (short)((ushort)(sVar107 < sVar23) * sVar23 | (ushort)(sVar107 >= sVar23) * sVar107)
                );
  auVar142._10_2_ =
       -(ushort)(auVar15._10_2_ <
                (short)((ushort)(sVar109 < sVar25) * sVar25 | (ushort)(sVar109 >= sVar25) * sVar109)
                );
  auVar142._12_2_ =
       -(ushort)(auVar15._12_2_ <
                (short)((ushort)(sVar111 < sVar27) * sVar27 | (ushort)(sVar111 >= sVar27) * sVar111)
                );
  auVar142._14_2_ =
       -(ushort)(auVar15._14_2_ <
                (short)((ushort)(sVar113 < sVar29) * sVar29 | (ushort)(sVar113 >= sVar29) * sVar113)
                );
  auVar14 = ~auVar142 & auVar14;
  auVar9._0_2_ = sVar11 - sVar30;
  auVar9._2_2_ = sVar16 - sVar38;
  auVar9._4_2_ = sVar18 - sVar40;
  auVar9._6_2_ = sVar20 - sVar42;
  auVar9._8_2_ = sVar22 - sVar44;
  auVar9._10_2_ = sVar24 - sVar46;
  auVar9._12_2_ = sVar26 - sVar48;
  auVar9._14_2_ = sVar28 - sVar50;
  auVar74 = pabsw(auVar15,auVar9);
  auVar56 = pmovsxbw(auVar36,0x303030303030303);
  auVar15._0_2_ = auVar56._0_2_ - auVar14._0_2_;
  auVar15._2_2_ = auVar56._2_2_ - auVar14._2_2_;
  auVar15._4_2_ = auVar56._4_2_ - auVar14._4_2_;
  auVar15._6_2_ = auVar56._6_2_ - auVar14._6_2_;
  auVar15._8_2_ = auVar56._8_2_ - auVar14._8_2_;
  auVar15._10_2_ = auVar56._10_2_ - auVar14._10_2_;
  auVar15._12_2_ = auVar56._12_2_ - auVar14._12_2_;
  auVar15._14_2_ = auVar56._14_2_ - auVar14._14_2_;
  sVar73 = auVar116._0_2_;
  auVar75._0_2_ = sVar73 + (ushort)(sVar11 == sVar118 && sVar30 == sVar129);
  sVar77 = auVar116._2_2_;
  auVar75._2_2_ = sVar77 + (ushort)(sVar16 == sVar121 && sVar38 == sVar132);
  sVar78 = auVar116._4_2_;
  auVar75._4_2_ = sVar78 + (ushort)(sVar18 == sVar122 && sVar40 == sVar133);
  sVar79 = auVar116._6_2_;
  auVar75._6_2_ = sVar79 + (ushort)(sVar20 == sVar123 && sVar42 == sVar134);
  sVar80 = auVar116._8_2_;
  auVar75._8_2_ = sVar80 + (ushort)(sVar22 == sVar124 && sVar44 == sVar135);
  sVar81 = auVar116._10_2_;
  auVar75._10_2_ = sVar81 + (ushort)(sVar24 == sVar125 && sVar46 == sVar136);
  sVar82 = auVar116._12_2_;
  sVar83 = auVar116._14_2_;
  auVar75._12_2_ = sVar82 + (ushort)(sVar26 == sVar126 && sVar48 == sVar137);
  auVar75._14_2_ = sVar83 + (ushort)(sVar28 == sVar127 && sVar50 == sVar138);
  auVar9 = pmovsxbw(auVar14,0x606060606060606);
  auVar116._0_2_ = -(ushort)(auVar9._0_2_ == sVar53);
  auVar116._2_2_ = -(ushort)(auVar9._2_2_ == sVar60);
  auVar116._4_2_ = -(ushort)(auVar9._4_2_ == sVar62);
  auVar116._6_2_ = -(ushort)(auVar9._6_2_ == sVar64);
  auVar116._8_2_ = -(ushort)(auVar9._8_2_ == sVar66);
  auVar116._10_2_ = -(ushort)(auVar9._10_2_ == sVar68);
  auVar116._12_2_ = -(ushort)(auVar9._12_2_ == sVar70);
  auVar116._14_2_ = -(ushort)(auVar9._14_2_ == sVar72);
  auVar9 = pmovsxbw(auVar15,0x505050505050505);
  auVar34._0_2_ = -(ushort)(auVar9._0_2_ == sVar53);
  auVar34._2_2_ = -(ushort)(auVar9._2_2_ == sVar60);
  auVar34._4_2_ = -(ushort)(auVar9._4_2_ == sVar62);
  auVar34._6_2_ = -(ushort)(auVar9._6_2_ == sVar64);
  auVar34._8_2_ = -(ushort)(auVar9._8_2_ == sVar66);
  auVar34._10_2_ = -(ushort)(auVar9._10_2_ == sVar68);
  auVar34._12_2_ = -(ushort)(auVar9._12_2_ == sVar70);
  auVar34._14_2_ = -(ushort)(auVar9._14_2_ == sVar72);
  auVar9 = pblendvb(auVar116 & auVar15,auVar75,auVar34);
  auVar14 = pmovsxbw(auVar75,0x101010101010101);
  auVar128._0_2_ = auVar14._0_2_ + (ushort)(sVar93 == sVar73);
  auVar128._2_2_ = auVar14._2_2_ + (ushort)(sVar100 == sVar77);
  auVar128._4_2_ = auVar14._4_2_ + (ushort)(sVar102 == sVar78);
  auVar128._6_2_ = auVar14._6_2_ + (ushort)(sVar104 == sVar79);
  auVar128._8_2_ = auVar14._8_2_ + (ushort)(sVar106 == sVar80);
  auVar128._10_2_ = auVar14._10_2_ + (ushort)(sVar108 == sVar81);
  auVar128._12_2_ = auVar14._12_2_ + (ushort)(sVar110 == sVar82);
  auVar128._14_2_ = auVar14._14_2_ + (ushort)(sVar112 == sVar83);
  auVar15 = pmovsxbw(in_XMM15,0x404040404040404);
  auVar90._0_2_ = (ushort)-(ushort)(auVar74._0_2_ < sVar114) >> 0xf;
  auVar90._2_2_ = (ushort)-(ushort)(auVar74._2_2_ < sVar115) >> 0xf;
  auVar90._4_2_ = (ushort)-(ushort)(auVar74._4_2_ < sVar114) >> 0xf;
  auVar90._6_2_ = (ushort)-(ushort)(auVar74._6_2_ < sVar115) >> 0xf;
  auVar90._8_2_ = (ushort)-(ushort)(auVar74._8_2_ < sVar114) >> 0xf;
  auVar90._10_2_ = (ushort)-(ushort)(auVar74._10_2_ < sVar115) >> 0xf;
  auVar90._12_2_ = (ushort)-(ushort)(auVar74._12_2_ < sVar114) >> 0xf;
  auVar90._14_2_ = (ushort)-(ushort)(auVar74._14_2_ < sVar115) >> 0xf;
  sVar93 = auVar15._0_2_;
  auVar36._0_2_ = -(ushort)(sVar53 == sVar93);
  sVar100 = auVar15._2_2_;
  auVar36._2_2_ = -(ushort)(sVar60 == sVar100);
  sVar102 = auVar15._4_2_;
  auVar36._4_2_ = -(ushort)(sVar62 == sVar102);
  sVar104 = auVar15._6_2_;
  auVar36._6_2_ = -(ushort)(sVar64 == sVar104);
  sVar106 = auVar15._8_2_;
  auVar36._8_2_ = -(ushort)(sVar66 == sVar106);
  sVar108 = auVar15._10_2_;
  auVar36._10_2_ = -(ushort)(sVar68 == sVar108);
  sVar110 = auVar15._12_2_;
  auVar36._12_2_ = -(ushort)(sVar70 == sVar110);
  sVar112 = auVar15._14_2_;
  auVar36._14_2_ = -(ushort)(sVar72 == sVar112);
  auVar9 = pblendvb(auVar9,auVar128,auVar36);
  auVar58._0_2_ = -(ushort)(sVar53 == auVar56._0_2_);
  auVar58._2_2_ = -(ushort)(sVar60 == auVar56._2_2_);
  auVar58._4_2_ = -(ushort)(sVar62 == auVar56._4_2_);
  auVar58._6_2_ = -(ushort)(sVar64 == auVar56._6_2_);
  auVar58._8_2_ = -(ushort)(sVar66 == auVar56._8_2_);
  auVar58._10_2_ = -(ushort)(sVar68 == auVar56._10_2_);
  auVar58._12_2_ = -(ushort)(sVar70 == auVar56._12_2_);
  auVar58._14_2_ = -(ushort)(sVar72 == auVar56._14_2_);
  auVar9 = pblendvb(auVar9,auVar90,auVar58);
  auVar9 = auVar9 & auVar84;
  auVar37._0_2_ = sVar129 + sVar118 + sVar73;
  auVar37._2_2_ = sVar132 + sVar121 + sVar77;
  auVar37._4_2_ = sVar133 + sVar122 + sVar78;
  auVar37._6_2_ = sVar134 + sVar123 + sVar79;
  auVar37._8_2_ = sVar135 + sVar124 + sVar80;
  auVar37._10_2_ = sVar136 + sVar125 + sVar81;
  auVar37._12_2_ = sVar137 + sVar126 + sVar82;
  auVar37._14_2_ = sVar138 + sVar127 + sVar83;
  sVar94 = sVar118 * 2;
  sVar101 = sVar121 * 2;
  sVar111 = sVar122 * 2;
  sVar113 = sVar123 * 2;
  sVar53 = sVar124 * 2;
  sVar60 = sVar125 * 2;
  sVar62 = sVar126 * 2;
  sVar107 = sVar127 * 2;
  sVar12 = auVar9._0_2_;
  auVar76._0_2_ = -(ushort)(auVar14._0_2_ == sVar12);
  sVar17 = auVar9._2_2_;
  auVar76._2_2_ = -(ushort)(auVar14._2_2_ == sVar17);
  sVar19 = auVar9._4_2_;
  auVar76._4_2_ = -(ushort)(auVar14._4_2_ == sVar19);
  sVar21 = auVar9._6_2_;
  auVar76._6_2_ = -(ushort)(auVar14._6_2_ == sVar21);
  sVar23 = auVar9._8_2_;
  auVar76._8_2_ = -(ushort)(auVar14._8_2_ == sVar23);
  sVar25 = auVar9._10_2_;
  auVar76._10_2_ = -(ushort)(auVar14._10_2_ == sVar25);
  sVar27 = auVar9._12_2_;
  auVar76._12_2_ = -(ushort)(auVar14._12_2_ == sVar27);
  sVar29 = auVar9._14_2_;
  auVar76._14_2_ = -(ushort)(auVar14._14_2_ == sVar29);
  auVar85._0_2_ = (ushort)(auVar37._0_2_ + sVar94) >> 2;
  auVar85._2_2_ = (ushort)(auVar37._2_2_ + sVar101) >> 2;
  auVar85._4_2_ = (ushort)(auVar37._4_2_ + sVar111) >> 2;
  auVar85._6_2_ = (ushort)(auVar37._6_2_ + sVar113) >> 2;
  auVar85._8_2_ = (ushort)(auVar37._8_2_ + sVar53) >> 2;
  auVar85._10_2_ = (ushort)(auVar37._10_2_ + sVar60) >> 2;
  auVar85._12_2_ = (ushort)(auVar37._12_2_ + sVar62) >> 2;
  auVar85._14_2_ = (ushort)(auVar37._14_2_ + sVar107) >> 2;
  auVar15 = pblendvb(auVar119,auVar85,auVar76);
  sVar103 = sVar129 * 2;
  sVar105 = sVar132 * 2;
  sVar64 = sVar133 * 2;
  sVar66 = sVar134 * 2;
  sVar68 = sVar135 * 2;
  sVar70 = sVar136 * 2;
  sVar72 = sVar137 * 2;
  sVar109 = sVar138 * 2;
  auVar86._0_2_ = (ushort)(auVar37._0_2_ + sVar103) >> 2;
  auVar86._2_2_ = (ushort)(auVar37._2_2_ + sVar105) >> 2;
  auVar86._4_2_ = (ushort)(auVar37._4_2_ + sVar64) >> 2;
  auVar86._6_2_ = (ushort)(auVar37._6_2_ + sVar66) >> 2;
  auVar86._8_2_ = (ushort)(auVar37._8_2_ + sVar68) >> 2;
  auVar86._10_2_ = (ushort)(auVar37._10_2_ + sVar70) >> 2;
  auVar86._12_2_ = (ushort)(auVar37._12_2_ + sVar72) >> 2;
  auVar86._14_2_ = (ushort)(auVar37._14_2_ + sVar109) >> 2;
  auVar14 = pblendvb(auVar130,auVar86,auVar76);
  auVar9 = psllw(auVar119,3);
  auVar117._0_2_ = -(ushort)(sVar73 == sVar12);
  auVar117._2_2_ = -(ushort)(sVar77 == sVar17);
  auVar117._4_2_ = -(ushort)(sVar78 == sVar19);
  auVar117._6_2_ = -(ushort)(sVar79 == sVar21);
  auVar117._8_2_ = -(ushort)(sVar80 == sVar23);
  auVar117._10_2_ = -(ushort)(sVar81 == sVar25);
  auVar117._12_2_ = -(ushort)(sVar82 == sVar27);
  auVar117._14_2_ = -(ushort)(sVar83 == sVar29);
  auVar97._0_2_ =
       (ushort)(auVar37._0_2_ * 2 + sVar93 + auVar9._0_2_ + sVar11 * 2 + sVar129 + sVar11) >> 4;
  auVar97._2_2_ =
       (ushort)(auVar37._2_2_ * 2 + sVar100 + auVar9._2_2_ + sVar16 * 2 + sVar132 + sVar16) >> 4;
  auVar97._4_2_ =
       (ushort)(auVar37._4_2_ * 2 + sVar102 + auVar9._4_2_ + sVar18 * 2 + sVar133 + sVar18) >> 4;
  auVar97._6_2_ =
       (ushort)(auVar37._6_2_ * 2 + sVar104 + auVar9._6_2_ + sVar20 * 2 + sVar134 + sVar20) >> 4;
  auVar97._8_2_ =
       (ushort)(auVar37._8_2_ * 2 + sVar106 + auVar9._8_2_ + sVar22 * 2 + sVar135 + sVar22) >> 4;
  auVar97._10_2_ =
       (ushort)(auVar37._10_2_ * 2 + sVar108 + auVar9._10_2_ + sVar24 * 2 + sVar136 + sVar24) >> 4;
  auVar97._12_2_ =
       (ushort)(auVar37._12_2_ * 2 + sVar110 + auVar9._12_2_ + sVar26 * 2 + sVar137 + sVar26) >> 4;
  auVar97._14_2_ =
       (ushort)(auVar37._14_2_ * 2 + sVar112 + auVar9._14_2_ + sVar28 * 2 + sVar138 + sVar28) >> 4;
  auVar15 = pblendvb(auVar15,auVar97,auVar117);
  auVar9 = psllw(auVar130,3);
  auVar91._0_2_ =
       (ushort)(auVar9._0_2_ + sVar30 * 2 + sVar30 + sVar118 + sVar93 + auVar37._0_2_ * 2) >> 4;
  auVar91._2_2_ =
       (ushort)(auVar9._2_2_ + sVar38 * 2 + sVar38 + sVar121 + sVar100 + auVar37._2_2_ * 2) >> 4;
  auVar91._4_2_ =
       (ushort)(auVar9._4_2_ + sVar40 * 2 + sVar40 + sVar122 + sVar102 + auVar37._4_2_ * 2) >> 4;
  auVar91._6_2_ =
       (ushort)(auVar9._6_2_ + sVar42 * 2 + sVar42 + sVar123 + sVar104 + auVar37._6_2_ * 2) >> 4;
  auVar91._8_2_ =
       (ushort)(auVar9._8_2_ + sVar44 * 2 + sVar44 + sVar124 + sVar106 + auVar37._8_2_ * 2) >> 4;
  auVar91._10_2_ =
       (ushort)(auVar9._10_2_ + sVar46 * 2 + sVar46 + sVar125 + sVar108 + auVar37._10_2_ * 2) >> 4;
  auVar91._12_2_ =
       (ushort)(auVar9._12_2_ + sVar48 * 2 + sVar48 + sVar126 + sVar110 + auVar37._12_2_ * 2) >> 4;
  auVar91._14_2_ =
       (ushort)(auVar9._14_2_ + sVar50 * 2 + sVar50 + sVar127 + sVar112 + auVar37._14_2_ * 2) >> 4;
  auVar34 = pblendvb(auVar14,auVar91,auVar117);
  auVar14 = psllw(auVar37,2);
  auVar9 = psllw(auVar140,2);
  auVar56._0_2_ = -(ushort)(sVar12 == 3);
  auVar56._2_2_ = -(ushort)(sVar17 == 3);
  auVar56._4_2_ = -(ushort)(sVar19 == 3);
  auVar56._6_2_ = -(ushort)(sVar21 == 3);
  auVar56._8_2_ = -(ushort)(sVar23 == 3);
  auVar56._10_2_ = -(ushort)(sVar25 == 3);
  auVar56._12_2_ = -(ushort)(sVar27 == 3);
  auVar56._14_2_ = -(ushort)(sVar29 == 3);
  auVar87._0_2_ = (ushort)(auVar9._0_2_ + sVar94 + sVar30 + sVar31 + auVar14._0_2_) >> 4;
  auVar87._2_2_ = (ushort)(auVar9._2_2_ + sVar101 + sVar38 + sVar39 + auVar14._2_2_) >> 4;
  auVar87._4_2_ = (ushort)(auVar9._4_2_ + sVar111 + sVar40 + sVar41 + auVar14._4_2_) >> 4;
  auVar87._6_2_ = (ushort)(auVar9._6_2_ + sVar113 + sVar42 + sVar43 + auVar14._6_2_) >> 4;
  auVar87._8_2_ = (ushort)(auVar9._8_2_ + sVar53 + sVar44 + sVar45 + auVar14._8_2_) >> 4;
  auVar87._10_2_ = (ushort)(auVar9._10_2_ + sVar60 + sVar46 + sVar47 + auVar14._10_2_) >> 4;
  auVar87._12_2_ = (ushort)(auVar9._12_2_ + sVar62 + sVar48 + sVar49 + auVar14._12_2_) >> 4;
  auVar87._14_2_ = (ushort)(auVar9._14_2_ + sVar107 + sVar50 + sVar51 + auVar14._14_2_) >> 4;
  auVar9 = pblendvb(auVar15,auVar87,auVar56);
  auVar15 = psllw(auVar139,2);
  auVar88._0_2_ = (ushort)(auVar15._0_2_ + sVar103 + sVar52 + sVar11 + auVar14._0_2_) >> 4;
  auVar88._2_2_ = (ushort)(auVar15._2_2_ + sVar105 + sVar59 + sVar16 + auVar14._2_2_) >> 4;
  auVar88._4_2_ = (ushort)(auVar15._4_2_ + sVar64 + sVar61 + sVar18 + auVar14._4_2_) >> 4;
  auVar88._6_2_ = (ushort)(auVar15._6_2_ + sVar66 + sVar63 + sVar20 + auVar14._6_2_) >> 4;
  auVar88._8_2_ = (ushort)(auVar15._8_2_ + sVar68 + sVar65 + sVar22 + auVar14._8_2_) >> 4;
  auVar88._10_2_ = (ushort)(auVar15._10_2_ + sVar70 + sVar67 + sVar24 + auVar14._10_2_) >> 4;
  auVar88._12_2_ = (ushort)(auVar15._12_2_ + sVar72 + sVar69 + sVar26 + auVar14._12_2_) >> 4;
  auVar88._14_2_ = (ushort)(auVar15._14_2_ + sVar109 + sVar71 + sVar28 + auVar14._14_2_) >> 4;
  auVar34 = pblendvb(auVar34,auVar88,auVar56);
  auVar36 = psllw(auVar140,3);
  auVar14 = psllw(auVar119,2);
  auVar74 = pmovsxbw(auVar117,0x808080808080808);
  auVar141._0_2_ =
       (ushort)(sVar129 + auVar74._0_2_ + auVar14._0_2_ + auVar36._0_2_ + sVar31 * 3) >> 4;
  auVar141._2_2_ =
       (ushort)(sVar132 + auVar74._2_2_ + auVar14._2_2_ + auVar36._2_2_ + sVar39 * 3) >> 4;
  auVar141._4_2_ =
       (ushort)(sVar133 + auVar74._4_2_ + auVar14._4_2_ + auVar36._4_2_ + sVar41 * 3) >> 4;
  auVar141._6_2_ =
       (ushort)(sVar134 + auVar74._6_2_ + auVar14._6_2_ + auVar36._6_2_ + sVar43 * 3) >> 4;
  auVar141._8_2_ =
       (ushort)(sVar135 + auVar74._8_2_ + auVar14._8_2_ + auVar36._8_2_ + sVar45 * 3) >> 4;
  auVar141._10_2_ =
       (ushort)(sVar136 + auVar74._10_2_ + auVar14._10_2_ + auVar36._10_2_ + sVar47 * 3) >> 4;
  auVar141._12_2_ =
       (ushort)(sVar137 + auVar74._12_2_ + auVar14._12_2_ + auVar36._12_2_ + sVar49 * 3) >> 4;
  auVar141._14_2_ =
       (ushort)(sVar138 + auVar74._14_2_ + auVar14._14_2_ + auVar36._14_2_ + sVar51 * 3) >> 4;
  auVar14 = pblendvb(auVar140,auVar141,auVar56);
  auVar142 = psllw(auVar139,3);
  auVar15 = psllw(auVar130,2);
  auVar130._0_2_ = sVar52 + auVar142._0_2_ + auVar15._0_2_ + sVar118;
  auVar130._2_2_ = sVar59 + auVar142._2_2_ + auVar15._2_2_ + sVar121;
  auVar130._4_2_ = sVar61 + auVar142._4_2_ + auVar15._4_2_ + sVar122;
  auVar130._6_2_ = sVar63 + auVar142._6_2_ + auVar15._6_2_ + sVar123;
  auVar130._8_2_ = sVar65 + auVar142._8_2_ + auVar15._8_2_ + sVar124;
  auVar130._10_2_ = sVar67 + auVar142._10_2_ + auVar15._10_2_ + sVar125;
  auVar130._12_2_ = sVar69 + auVar142._12_2_ + auVar15._12_2_ + sVar126;
  auVar130._14_2_ = sVar71 + auVar142._14_2_ + auVar15._14_2_ + sVar127;
  auVar140._0_2_ = (ushort)(sVar52 * 2 + auVar74._0_2_ + auVar130._0_2_) >> 4;
  auVar140._2_2_ = (ushort)(sVar59 * 2 + auVar74._2_2_ + auVar130._2_2_) >> 4;
  auVar140._4_2_ = (ushort)(sVar61 * 2 + auVar74._4_2_ + auVar130._4_2_) >> 4;
  auVar140._6_2_ = (ushort)(sVar63 * 2 + auVar74._6_2_ + auVar130._6_2_) >> 4;
  auVar140._8_2_ = (ushort)(sVar65 * 2 + auVar74._8_2_ + auVar130._8_2_) >> 4;
  auVar140._10_2_ = (ushort)(sVar67 * 2 + auVar74._10_2_ + auVar130._10_2_) >> 4;
  auVar140._12_2_ = (ushort)(sVar69 * 2 + auVar74._12_2_ + auVar130._12_2_) >> 4;
  auVar140._14_2_ = (ushort)(sVar71 * 2 + auVar74._14_2_ + auVar130._14_2_) >> 4;
  auVar15 = pblendvb(auVar139,auVar140,auVar56);
  ppVar6 = src + lVar8;
  auVar119._0_2_ = -(ushort)(sVar12 == 4);
  auVar119._2_2_ = -(ushort)(sVar17 == 4);
  auVar119._4_2_ = -(ushort)(sVar19 == 4);
  auVar119._6_2_ = -(ushort)(sVar21 == 4);
  auVar119._8_2_ = -(ushort)(sVar23 == 4);
  auVar119._10_2_ = -(ushort)(sVar25 == 4);
  auVar119._12_2_ = -(ushort)(sVar27 == 4);
  auVar119._14_2_ = -(ushort)(sVar29 == 4);
  ppVar1 = ppVar7;
  if (auVar119 != (undefined1  [16])0x0) {
    auVar74 = psllw(auVar37,3);
    auVar56 = pmovsxbw(auVar130,0x303030303030303);
    auVar92._0_2_ =
         (ushort)((sVar30 + sVar31) * auVar56._0_2_ + auVar36._0_2_ + sVar94 + auVar74._0_2_) >> 5;
    auVar92._2_2_ =
         (ushort)((sVar38 + sVar39) * auVar56._2_2_ + auVar36._2_2_ + sVar101 + auVar74._2_2_) >> 5;
    auVar92._4_2_ =
         (ushort)((sVar40 + sVar41) * auVar56._4_2_ + auVar36._4_2_ + sVar111 + auVar74._4_2_) >> 5;
    auVar92._6_2_ =
         (ushort)((sVar42 + sVar43) * auVar56._6_2_ + auVar36._6_2_ + sVar113 + auVar74._6_2_) >> 5;
    auVar92._8_2_ =
         (ushort)((sVar44 + sVar45) * auVar56._8_2_ + auVar36._8_2_ + sVar53 + auVar74._8_2_) >> 5;
    auVar92._10_2_ =
         (ushort)((sVar46 + sVar47) * auVar56._10_2_ + auVar36._10_2_ + sVar60 + auVar74._10_2_) >>
         5;
    auVar92._12_2_ =
         (ushort)((sVar48 + sVar49) * auVar56._12_2_ + auVar36._12_2_ + sVar62 + auVar74._12_2_) >>
         5;
    auVar92._14_2_ =
         (ushort)((sVar50 + sVar51) * auVar56._14_2_ + auVar36._14_2_ + sVar107 + auVar74._14_2_) >>
         5;
    auVar36 = pblendvb(auVar9,auVar92,auVar119);
    auVar139._2_2_ = sVar105;
    auVar139._0_2_ = sVar103;
    auVar139._4_2_ = sVar64;
    auVar139._6_2_ = sVar66;
    auVar139._8_2_ = sVar68;
    auVar139._10_2_ = sVar70;
    auVar139._12_2_ = sVar72;
    auVar139._14_2_ = sVar109;
    auVar143._0_2_ =
         (ushort)((sVar52 + sVar11) * auVar56._0_2_ + auVar142._0_2_ + sVar103 + auVar74._0_2_) >> 5
    ;
    auVar143._2_2_ =
         (ushort)((sVar59 + sVar16) * auVar56._2_2_ + auVar142._2_2_ + sVar105 + auVar74._2_2_) >> 5
    ;
    auVar143._4_2_ =
         (ushort)((sVar61 + sVar18) * auVar56._4_2_ + auVar142._4_2_ + sVar64 + auVar74._4_2_) >> 5;
    auVar143._6_2_ =
         (ushort)((sVar63 + sVar20) * auVar56._6_2_ + auVar142._6_2_ + sVar66 + auVar74._6_2_) >> 5;
    auVar143._8_2_ =
         (ushort)((sVar65 + sVar22) * auVar56._8_2_ + auVar142._8_2_ + sVar68 + auVar74._8_2_) >> 5;
    auVar143._10_2_ =
         (ushort)((sVar67 + sVar24) * auVar56._10_2_ + auVar142._10_2_ + sVar70 + auVar74._10_2_) >>
         5;
    auVar143._12_2_ =
         (ushort)((sVar69 + sVar26) * auVar56._12_2_ + auVar142._12_2_ + sVar72 + auVar74._12_2_) >>
         5;
    auVar143._14_2_ =
         (ushort)((sVar71 + sVar28) * auVar56._14_2_ + auVar142._14_2_ + sVar109 + auVar74._14_2_)
         >> 5;
    auVar56 = pblendvb(auVar34,auVar143,auVar119);
    auVar120._0_2_ = sVar118 + sVar11 + sVar31;
    auVar120._2_2_ = sVar121 + sVar16 + sVar39;
    auVar120._4_2_ = sVar122 + sVar18 + sVar41;
    auVar120._6_2_ = sVar123 + sVar20 + sVar43;
    auVar120._8_2_ = sVar124 + sVar22 + sVar45;
    auVar120._10_2_ = sVar125 + sVar24 + sVar47;
    auVar120._12_2_ = sVar126 + sVar26 + sVar49;
    auVar120._14_2_ = sVar127 + sVar28 + sVar51;
    auVar9 = psllw(auVar120,2);
    auVar34 = pmovsxbw(auVar139,0x808080808080808);
    auVar98._0_2_ = (ushort)(sVar129 + sVar11 + sVar103 + auVar34._0_2_ + auVar9._0_2_) >> 4;
    auVar98._2_2_ = (ushort)(sVar132 + sVar16 + sVar105 + auVar34._2_2_ + auVar9._2_2_) >> 4;
    auVar98._4_2_ = (ushort)(sVar133 + sVar18 + sVar64 + auVar34._4_2_ + auVar9._4_2_) >> 4;
    auVar98._6_2_ = (ushort)(sVar134 + sVar20 + sVar66 + auVar34._6_2_ + auVar9._6_2_) >> 4;
    auVar98._8_2_ = (ushort)(sVar135 + sVar22 + sVar68 + auVar34._8_2_ + auVar9._8_2_) >> 4;
    auVar98._10_2_ = (ushort)(sVar136 + sVar24 + sVar70 + auVar34._10_2_ + auVar9._10_2_) >> 4;
    auVar98._12_2_ = (ushort)(sVar137 + sVar26 + sVar72 + auVar34._12_2_ + auVar9._12_2_) >> 4;
    auVar98._14_2_ = (ushort)(sVar138 + sVar28 + sVar109 + auVar34._14_2_ + auVar9._14_2_) >> 4;
    auVar9 = pblendvb(auVar14,auVar98,auVar119);
    auVar10._0_2_ = sVar129 + sVar30 + sVar52;
    auVar10._2_2_ = sVar132 + sVar38 + sVar59;
    auVar10._4_2_ = sVar133 + sVar40 + sVar61;
    auVar10._6_2_ = sVar134 + sVar42 + sVar63;
    auVar10._8_2_ = sVar135 + sVar44 + sVar65;
    auVar10._10_2_ = sVar136 + sVar46 + sVar67;
    auVar10._12_2_ = sVar137 + sVar48 + sVar69;
    auVar10._14_2_ = sVar138 + sVar50 + sVar71;
    auVar14 = psllw(auVar10,2);
    auVar99._0_2_ = (ushort)(sVar30 + sVar118 + sVar94 + auVar34._0_2_ + auVar14._0_2_) >> 4;
    auVar99._2_2_ = (ushort)(sVar38 + sVar121 + sVar101 + auVar34._2_2_ + auVar14._2_2_) >> 4;
    auVar99._4_2_ = (ushort)(sVar40 + sVar122 + sVar111 + auVar34._4_2_ + auVar14._4_2_) >> 4;
    auVar99._6_2_ = (ushort)(sVar42 + sVar123 + sVar113 + auVar34._6_2_ + auVar14._6_2_) >> 4;
    auVar99._8_2_ = (ushort)(sVar44 + sVar124 + sVar53 + auVar34._8_2_ + auVar14._8_2_) >> 4;
    auVar99._10_2_ = (ushort)(sVar46 + sVar125 + sVar60 + auVar34._10_2_ + auVar14._10_2_) >> 4;
    auVar99._12_2_ = (ushort)(sVar48 + sVar126 + sVar62 + auVar34._12_2_ + auVar14._12_2_) >> 4;
    auVar99._14_2_ = (ushort)(sVar50 + sVar127 + sVar107 + auVar34._14_2_ + auVar14._14_2_) >> 4;
    auVar34 = pblendvb(auVar15,auVar99,auVar119);
    auVar14 = pmovzxbw(auVar119,*(undefined8 *)(src + -(long)(stride << 2)));
    sVar94 = sVar129 + sVar118 + 4;
    sVar101 = sVar132 + sVar121 + 4;
    sVar103 = sVar133 + sVar122 + 4;
    sVar105 = sVar134 + sVar123 + 4;
    sVar107 = sVar135 + sVar124 + 4;
    sVar109 = sVar136 + sVar125 + 4;
    sVar111 = sVar137 + sVar126 + 4;
    sVar113 = sVar138 + sVar127 + 4;
    auVar131._0_2_ = (ushort)((sVar11 + sVar31 + auVar14._0_2_) * 2 + sVar94) >> 3;
    auVar131._2_2_ = (ushort)((sVar16 + sVar39 + auVar14._2_2_) * 2 + sVar101) >> 3;
    auVar131._4_2_ = (ushort)((sVar18 + sVar41 + auVar14._4_2_) * 2 + sVar103) >> 3;
    auVar131._6_2_ = (ushort)((sVar20 + sVar43 + auVar14._6_2_) * 2 + sVar105) >> 3;
    auVar131._8_2_ = (ushort)((sVar22 + sVar45 + auVar14._8_2_) * 2 + sVar107) >> 3;
    auVar131._10_2_ = (ushort)((sVar24 + sVar47 + auVar14._10_2_) * 2 + sVar109) >> 3;
    auVar131._12_2_ = (ushort)((sVar26 + sVar49 + auVar14._12_2_) * 2 + sVar111) >> 3;
    auVar131._14_2_ = (ushort)((sVar28 + sVar51 + auVar14._14_2_) * 2 + sVar113) >> 3;
    auVar14 = pblendvb(auVar95,auVar131,auVar119);
    auVar15 = pmovzxbw(auVar119,*(undefined8 *)(src + stride * 3));
    auVar95._0_2_ = (ushort)((sVar30 + sVar52 + auVar15._0_2_) * 2 + sVar94) >> 3;
    auVar95._2_2_ = (ushort)((sVar38 + sVar59 + auVar15._2_2_) * 2 + sVar101) >> 3;
    auVar95._4_2_ = (ushort)((sVar40 + sVar61 + auVar15._4_2_) * 2 + sVar103) >> 3;
    auVar95._6_2_ = (ushort)((sVar42 + sVar63 + auVar15._6_2_) * 2 + sVar105) >> 3;
    auVar95._8_2_ = (ushort)((sVar44 + sVar65 + auVar15._8_2_) * 2 + sVar107) >> 3;
    auVar95._10_2_ = (ushort)((sVar46 + sVar67 + auVar15._10_2_) * 2 + sVar109) >> 3;
    auVar95._12_2_ = (ushort)((sVar48 + sVar69 + auVar15._12_2_) * 2 + sVar111) >> 3;
    auVar95._14_2_ = (ushort)((sVar50 + sVar71 + auVar15._14_2_) * 2 + sVar113) >> 3;
    auVar15 = pblendvb(auVar54,auVar95,auVar119);
    sVar94 = auVar36._0_2_;
    sVar101 = auVar36._2_2_;
    sVar103 = auVar36._4_2_;
    sVar105 = auVar36._6_2_;
    sVar107 = auVar36._8_2_;
    sVar109 = auVar36._10_2_;
    sVar111 = auVar36._12_2_;
    sVar113 = auVar36._14_2_;
    *(ulong *)ppVar2 =
         CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar36[0xe] - (0xff < sVar113),
                  CONCAT16((0 < sVar111) * (sVar111 < 0x100) * auVar36[0xc] - (0xff < sVar111),
                           CONCAT15((0 < sVar109) * (sVar109 < 0x100) * auVar36[10] -
                                    (0xff < sVar109),
                                    CONCAT14((0 < sVar107) * (sVar107 < 0x100) * auVar36[8] -
                                             (0xff < sVar107),
                                             CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar36[6]
                                                      - (0xff < sVar105),
                                                      CONCAT12((0 < sVar103) * (sVar103 < 0x100) *
                                                               auVar36[4] - (0xff < sVar103),
                                                               CONCAT11((0 < sVar101) *
                                                                        (sVar101 < 0x100) *
                                                                        auVar36[2] -
                                                                        (0xff < sVar101),
                                                                        (0 < sVar94) *
                                                                        (sVar94 < 0x100) *
                                                                        auVar36[0] - (0xff < sVar94)
                                                                       )))))));
    sVar94 = auVar56._0_2_;
    sVar101 = auVar56._2_2_;
    sVar103 = auVar56._4_2_;
    sVar105 = auVar56._6_2_;
    sVar107 = auVar56._8_2_;
    sVar109 = auVar56._10_2_;
    sVar111 = auVar56._12_2_;
    sVar113 = auVar56._14_2_;
    *(ulong *)src =
         CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar56[0xe] - (0xff < sVar113),
                  CONCAT16((0 < sVar111) * (sVar111 < 0x100) * auVar56[0xc] - (0xff < sVar111),
                           CONCAT15((0 < sVar109) * (sVar109 < 0x100) * auVar56[10] -
                                    (0xff < sVar109),
                                    CONCAT14((0 < sVar107) * (sVar107 < 0x100) * auVar56[8] -
                                             (0xff < sVar107),
                                             CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar56[6]
                                                      - (0xff < sVar105),
                                                      CONCAT12((0 < sVar103) * (sVar103 < 0x100) *
                                                               auVar56[4] - (0xff < sVar103),
                                                               CONCAT11((0 < sVar101) *
                                                                        (sVar101 < 0x100) *
                                                                        auVar56[2] -
                                                                        (0xff < sVar101),
                                                                        (0 < sVar94) *
                                                                        (sVar94 < 0x100) *
                                                                        auVar56[0] - (0xff < sVar94)
                                                                       )))))));
    ppVar4 = src + lVar3;
    ppVar1 = src + -(long)(stride * 3);
    ppVar2 = ppVar7;
    src = ppVar6;
    ppVar6 = ppVar4;
  }
  sVar94 = auVar9._0_2_;
  sVar101 = auVar9._2_2_;
  sVar103 = auVar9._4_2_;
  sVar105 = auVar9._6_2_;
  sVar107 = auVar9._8_2_;
  sVar109 = auVar9._10_2_;
  sVar111 = auVar9._12_2_;
  sVar113 = auVar9._14_2_;
  *(ulong *)ppVar2 =
       CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar9[0xe] - (0xff < sVar113),
                CONCAT16((0 < sVar111) * (sVar111 < 0x100) * auVar9[0xc] - (0xff < sVar111),
                         CONCAT15((0 < sVar109) * (sVar109 < 0x100) * auVar9[10] - (0xff < sVar109),
                                  CONCAT14((0 < sVar107) * (sVar107 < 0x100) * auVar9[8] -
                                           (0xff < sVar107),
                                           CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar9[6] -
                                                    (0xff < sVar105),
                                                    CONCAT12((0 < sVar103) * (sVar103 < 0x100) *
                                                             auVar9[4] - (0xff < sVar103),
                                                             CONCAT11((0 < sVar101) *
                                                                      (sVar101 < 0x100) * auVar9[2]
                                                                      - (0xff < sVar101),
                                                                      (0 < sVar94) *
                                                                      (sVar94 < 0x100) * auVar9[0] -
                                                                      (0xff < sVar94))))))));
  sVar94 = auVar34._0_2_;
  sVar101 = auVar34._2_2_;
  sVar103 = auVar34._4_2_;
  sVar105 = auVar34._6_2_;
  sVar107 = auVar34._8_2_;
  sVar109 = auVar34._10_2_;
  sVar111 = auVar34._12_2_;
  sVar113 = auVar34._14_2_;
  *(ulong *)src =
       CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar34[0xe] - (0xff < sVar113),
                CONCAT16((0 < sVar111) * (sVar111 < 0x100) * auVar34[0xc] - (0xff < sVar111),
                         CONCAT15((0 < sVar109) * (sVar109 < 0x100) * auVar34[10] - (0xff < sVar109)
                                  ,CONCAT14((0 < sVar107) * (sVar107 < 0x100) * auVar34[8] -
                                            (0xff < sVar107),
                                            CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar34[6]
                                                     - (0xff < sVar105),
                                                     CONCAT12((0 < sVar103) * (sVar103 < 0x100) *
                                                              auVar34[4] - (0xff < sVar103),
                                                              CONCAT11((0 < sVar101) *
                                                                       (sVar101 < 0x100) *
                                                                       auVar34[2] - (0xff < sVar101)
                                                                       ,(0 < sVar94) *
                                                                        (sVar94 < 0x100) *
                                                                        auVar34[0] - (0xff < sVar94)
                                                                      )))))));
  sVar94 = auVar14._0_2_;
  sVar101 = auVar14._2_2_;
  sVar103 = auVar14._4_2_;
  sVar105 = auVar14._6_2_;
  sVar107 = auVar14._8_2_;
  sVar109 = auVar14._10_2_;
  sVar111 = auVar14._12_2_;
  sVar113 = auVar14._14_2_;
  *(ulong *)ppVar1 =
       CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar14[0xe] - (0xff < sVar113),
                CONCAT16((0 < sVar111) * (sVar111 < 0x100) * auVar14[0xc] - (0xff < sVar111),
                         CONCAT15((0 < sVar109) * (sVar109 < 0x100) * auVar14[10] - (0xff < sVar109)
                                  ,CONCAT14((0 < sVar107) * (sVar107 < 0x100) * auVar14[8] -
                                            (0xff < sVar107),
                                            CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar14[6]
                                                     - (0xff < sVar105),
                                                     CONCAT12((0 < sVar103) * (sVar103 < 0x100) *
                                                              auVar14[4] - (0xff < sVar103),
                                                              CONCAT11((0 < sVar101) *
                                                                       (sVar101 < 0x100) *
                                                                       auVar14[2] - (0xff < sVar101)
                                                                       ,(0 < sVar94) *
                                                                        (sVar94 < 0x100) *
                                                                        auVar14[0] - (0xff < sVar94)
                                                                      )))))));
  sVar94 = auVar15._0_2_;
  sVar101 = auVar15._2_2_;
  sVar103 = auVar15._4_2_;
  sVar105 = auVar15._6_2_;
  sVar107 = auVar15._8_2_;
  sVar109 = auVar15._10_2_;
  sVar111 = auVar15._12_2_;
  sVar113 = auVar15._14_2_;
  *(ulong *)ppVar6 =
       CONCAT17((0 < sVar113) * (sVar113 < 0x100) * auVar15[0xe] - (0xff < sVar113),
                CONCAT16((0 < sVar111) * (sVar111 < 0x100) * auVar15[0xc] - (0xff < sVar111),
                         CONCAT15((0 < sVar109) * (sVar109 < 0x100) * auVar15[10] - (0xff < sVar109)
                                  ,CONCAT14((0 < sVar107) * (sVar107 < 0x100) * auVar15[8] -
                                            (0xff < sVar107),
                                            CONCAT13((0 < sVar105) * (sVar105 < 0x100) * auVar15[6]
                                                     - (0xff < sVar105),
                                                     CONCAT12((0 < sVar103) * (sVar103 < 0x100) *
                                                              auVar15[4] - (0xff < sVar103),
                                                              CONCAT11((0 < sVar101) *
                                                                       (sVar101 < 0x100) *
                                                                       auVar15[2] - (0xff < sVar101)
                                                                       ,(0 < sVar94) *
                                                                        (sVar94 < 0x100) *
                                                                        auVar15[0] - (0xff < sVar94)
                                                                      )))))));
  return;
}

Assistant:

void uavs3d_deblock_hor_luma_sse(pel *src, int stride, int alpha, int beta, int flt_flag)
{
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int inc4 = inc << 2;
    int flag0 = -(flt_flag & 1);
    int flag1 = -((flt_flag >> 8) & 1);

    __m128i TL0, TL1, TL2, TL3;
    __m128i TR0, TR1, TR2, TR3;
    __m128i TL0w, TL1w, TL2w, TR0w, TR1w, TR2w; //for swap
    __m128i V0, V1, V2, V3;
    __m128i T0, T1, T2, T3, T4, T5, T6, T7;
    __m128i M0, M1, M2;
    __m128i FLT_L, FLT_R, FLT, FS;
    __m128i FS3, FS4, FS5, FS6;

    __m128i ALPHA = _mm_set1_epi16((short)alpha);
    __m128i BETA = _mm_set1_epi16((short)beta);
    __m128i c_0 = _mm_set1_epi16(0);
    __m128i c_1 = _mm_set1_epi16(1);
    __m128i c_2 = _mm_set1_epi16(2);
    __m128i c_3 = _mm_set1_epi16(3);
    __m128i c_4 = _mm_set1_epi16(4);
    __m128i c_5 = _mm_set1_epi16(5);
    __m128i c_6 = _mm_set1_epi16(6);
    __m128i c_8 = _mm_set1_epi16(8);

    TL3 = _mm_loadl_epi64((__m128i*)(src - inc4));
    TL2 = _mm_loadl_epi64((__m128i*)(src - inc3));
    TL1 = _mm_loadl_epi64((__m128i*)(src - inc2));
    TL0 = _mm_loadl_epi64((__m128i*)(src - inc));
    TR0 = _mm_loadl_epi64((__m128i*)(src + 0));
    TR1 = _mm_loadl_epi64((__m128i*)(src + inc));
    TR2 = _mm_loadl_epi64((__m128i*)(src + inc2));
    TR3 = _mm_loadl_epi64((__m128i*)(src + inc3));

    TL3 = _mm_unpacklo_epi8(TL3, c_0);
    TL2 = _mm_unpacklo_epi8(TL2, c_0);
    TL1 = _mm_unpacklo_epi8(TL1, c_0);
    TL0 = _mm_unpacklo_epi8(TL0, c_0);
    TR0 = _mm_unpacklo_epi8(TR0, c_0);
    TR1 = _mm_unpacklo_epi8(TR1, c_0);
    TR2 = _mm_unpacklo_epi8(TR2, c_0);
    TR3 = _mm_unpacklo_epi8(TR3, c_0);


    M0 = _mm_set_epi32(flag1, flag1, flag0, flag0);

    T0 = _mm_subabs_epu16(TL1, TL0);
    T1 = _mm_subabs_epu16(TR1, TR0);
    FLT_L = _mm_and_si128(_mm_cmpgt_epi16(BETA, T0), c_2);
    FLT_R = _mm_and_si128(_mm_cmpgt_epi16(BETA, T1), c_2);

    T4 = _mm_subabs_epu16(TL2, TL0);
    T5 = _mm_subabs_epu16(TR2, TR0);
    M1 = _mm_cmpgt_epi16(BETA, T4);
    M2 = _mm_cmpgt_epi16(BETA, T5);

    T6 = _mm_subabs_epu16(TL0, TR0); // abs0
    T2 = _mm_cmpgt_epi16(ALPHA, T6); // abs0 < alpha
    T3 = _mm_srai_epi16(BETA, 2);    // Beta / 4 

    FLT_L = _mm_add_epi16(_mm_and_si128(M1, c_1), FLT_L);
    FLT_R = _mm_add_epi16(_mm_and_si128(M2, c_1), FLT_R);
    FLT = _mm_add_epi16(FLT_L, FLT_R);

    // !(COM_ABS(R0 - R1) <= Beta / 4 || COM_ABS(L0 - L1) <= Beta / 4)
    M1 = _mm_or_si128(_mm_cmpgt_epi16(T0, T3), _mm_cmpgt_epi16(T1, T3));
    M2 = _mm_and_si128(_mm_cmpeq_epi16(TR0, TR1), _mm_cmpeq_epi16(TL0, TL1));
    M1 = _mm_andnot_si128(M1, T2);

    T7 = _mm_subabs_epu16(TL1, TR1);
    FS6 = _mm_blendv_epi8(c_3, c_4, M1);
    FS5 = _mm_blendv_epi8(c_2, c_3, M2);
    FS4 = _mm_blendv_epi8(c_1, c_2, _mm_cmpeq_epi16(FLT_L, c_2));
    FS3 = _mm_blendv_epi8(c_0, c_1, _mm_cmpgt_epi16(BETA, T7));

    FS = _mm_blendv_epi8(c_0, FS6, _mm_cmpeq_epi16(FLT, c_6));
    FS = _mm_blendv_epi8(FS, FS5, _mm_cmpeq_epi16(FLT, c_5));
    FS = _mm_blendv_epi8(FS, FS4, _mm_cmpeq_epi16(FLT, c_4));
    FS = _mm_blendv_epi8(FS, FS3, _mm_cmpeq_epi16(FLT, c_3));

    FS = _mm_and_si128(FS, M0);

    TL0w = TL0;
    TL1w = TL1;
    TR0w = TR0;
    TR1w = TR1;

    /* fs == 1 */
    V0 = _mm_add_epi16(TL0w, TR0w);         // L0 + R0
    V1 = _mm_add_epi16(V0, c_2);            // L0 + R0 + 2
    V2 = _mm_slli_epi16(TL0w, 1);           // L0 << 1
    V3 = _mm_slli_epi16(TR0w, 1);

    T2 = _mm_cmpeq_epi16(FS, c_1);
    T0 = _mm_srli_epi16(_mm_add_epi16(V2, V1), 2);
    T1 = _mm_srli_epi16(_mm_add_epi16(V3, V1), 2);

    TL0 = _mm_blendv_epi8(TL0, T0, T2);
    TR0 = _mm_blendv_epi8(TR0, T1, T2);

    /* fs == 2 */
    V1 = _mm_slli_epi16(V1, 1);             // (L0 << 1) + (R0 << 1) + 4
    T0 = _mm_add_epi16(TL1w, TR0w);         // L1 + R0
    T1 = _mm_add_epi16(TR1w, TL0w);
    T2 = _mm_slli_epi16(TL1w, 1);           // L1 << 1
    T3 = _mm_slli_epi16(TR1w, 1);
    T0 = _mm_add_epi16(T0, V1);             // L1 + R0 + L0*2 + R0*2 + 4
    T1 = _mm_add_epi16(T1, V1);
    T4 = _mm_slli_epi16(TL0w, 3);           // L0*8
    T5 = _mm_slli_epi16(TR0w, 3);
    T0 = _mm_add_epi16(T0, T2);
    T1 = _mm_add_epi16(T1, T3);
    T4 = _mm_add_epi16(T4, c_4);
    T5 = _mm_add_epi16(T5, c_4);

    T2 = _mm_cmpeq_epi16(FS, c_2);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);
    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL0 = _mm_blendv_epi8(TL0, T0, T2);
    TR0 = _mm_blendv_epi8(TR0, T1, T2);

    /* fs == 3 */
    V1 = _mm_slli_epi16(V1, 1);             // (L0 << 2) + (R0 << 2) + 8
    T0 = _mm_slli_epi16(TL1w, 2);           // L1 << 2
    T1 = _mm_slli_epi16(TR1w, 2);
    T4 = _mm_add_epi16(TL2, TR1w);          // L2 + R1
    T5 = _mm_add_epi16(TR2, TL1w);

    T0 = _mm_add_epi16(T0, V2);             // (L1 << 2) + (L0 << 1)
    T1 = _mm_add_epi16(T1, V3);
    T4 = _mm_add_epi16(T4, V1);
    T5 = _mm_add_epi16(T5, V1);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);

    T6 = _mm_cmpeq_epi16(FS, c_3);
    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL0 = _mm_blendv_epi8(TL0, T0, T6);
    TR0 = _mm_blendv_epi8(TR0, T1, T6);

    T2 = _mm_add_epi16(TL2, TR0w);          // L2 + R0
    T3 = _mm_add_epi16(TR2, TL0w);
    T4 = _mm_slli_epi16(TL2, 1);
    T5 = _mm_slli_epi16(TR2, 1);
    T0 = _mm_slli_epi16(TL1w, 3);
    T1 = _mm_slli_epi16(TR1w, 3);
    T2 = _mm_add_epi16(T2, T4);             // L2 + R0 + L2*2
    T3 = _mm_add_epi16(T3, T5);
    T4 = _mm_slli_epi16(TL0w, 2);           // L0*4
    T5 = _mm_slli_epi16(TR0w, 2);
    T0 = _mm_add_epi16(T0, T2);
    T1 = _mm_add_epi16(T1, T3);
    T4 = _mm_add_epi16(T4, c_8);
    T5 = _mm_add_epi16(T5, c_8);
    T0 = _mm_add_epi16(T0, T4);
    T1 = _mm_add_epi16(T1, T5);

    T0 = _mm_srli_epi16(T0, 4);
    T1 = _mm_srli_epi16(T1, 4);

    TL1 = _mm_blendv_epi8(TL1, T0, T6);
    TR1 = _mm_blendv_epi8(TR1, T1, T6);

    FS = _mm_cmpeq_epi16(FS, c_4);

    if (!_mm_testz_si128(FS, _mm_set1_epi16(-1))) { /* fs == 4 */
        TL2w = TL2;
        TR2w = TR2;

        /* cal L0/R0 */
        V1 = _mm_slli_epi16(V1, 1);         // (L0 << 3) + (R0 << 3) + 16
        T0 = _mm_slli_epi16(TL1w, 3);       // L1 << 3
        T1 = _mm_slli_epi16(TR1w, 3);
        T2 = _mm_add_epi16(TL2w, TR1w);     // L2 + R1
        T3 = _mm_add_epi16(TR2w, TL1w);
        T0 = _mm_add_epi16(T0, V2);         // L0*2 + L1*8
        T1 = _mm_add_epi16(T1, V3);
        T4 = _mm_slli_epi16(T2, 1);
        T5 = _mm_slli_epi16(T3, 1);
        T0 = _mm_add_epi16(T0, V1);
        T1 = _mm_add_epi16(T1, V1);
        T2 = _mm_add_epi16(T2, T4);         // (L2 + R1) * 3
        T3 = _mm_add_epi16(T3, T5);

        T0 = _mm_add_epi16(T0, T2);
        T1 = _mm_add_epi16(T1, T3);
        T0 = _mm_srli_epi16(T0, 5);
        T1 = _mm_srli_epi16(T1, 5);

        TL0 = _mm_blendv_epi8(TL0, T0, FS);
        TR0 = _mm_blendv_epi8(TR0, T1, FS);

        /* cal L1/R1 */
        T4 = _mm_add_epi16(TL2w, TL1w);      // L2 + L1
        T5 = _mm_add_epi16(TR2w, TR1w);
        T2 = _mm_add_epi16(TR0w, TL1w);      // L1 + R0
        T3 = _mm_add_epi16(TL0w, TR1w);
        T0 = _mm_add_epi16(T4, TL0w);        // L0 + L1 + L2
        T1 = _mm_add_epi16(T5, TR0w);
        T2 = _mm_add_epi16(T2, V3);          // L1 + R0*3
        T3 = _mm_add_epi16(T3, V2);
        T0 = _mm_add_epi16(_mm_slli_epi16(T0, 2), T2);
        T1 = _mm_add_epi16(_mm_slli_epi16(T1, 2), T3);
        T0 = _mm_add_epi16(T0, c_8);
        T1 = _mm_add_epi16(T1, c_8);
        T0 = _mm_srli_epi16(T0, 4);
        T1 = _mm_srli_epi16(T1, 4);

        TL1 = _mm_blendv_epi8(TL1, T0, FS);
        TR1 = _mm_blendv_epi8(TR1, T1, FS);

        /* cal L2/R2 */
        T2 = _mm_add_epi16(T4, TL3);        // L1 + L2 + L3
        T3 = _mm_add_epi16(T5, TR3);
        T0 = _mm_add_epi16(V0, c_4);
        T2 = _mm_slli_epi16(T2, 1);
        T3 = _mm_slli_epi16(T3, 1);
        T2 = _mm_add_epi16(T2, T0);
        T3 = _mm_add_epi16(T3, T0);
        T0 = _mm_srli_epi16(T2, 3);
        T1 = _mm_srli_epi16(T3, 3);

        TL2 = _mm_blendv_epi8(TL2, T0, FS);
        TR2 = _mm_blendv_epi8(TR2, T1, FS);

        /* stroe result */
        _mm_storel_epi64((__m128i*)(src - inc), _mm_packus_epi16(TL0, c_0));
        _mm_storel_epi64((__m128i*)(src - 0), _mm_packus_epi16(TR0, c_0));

        _mm_storel_epi64((__m128i*)(src - inc2), _mm_packus_epi16(TL1, c_0));
        _mm_storel_epi64((__m128i*)(src + inc), _mm_packus_epi16(TR1, c_0));

        _mm_storel_epi64((__m128i*)(src - inc3), _mm_packus_epi16(TL2, c_0));
        _mm_storel_epi64((__m128i*)(src + inc2), _mm_packus_epi16(TR2, c_0));
    }
    else {
        /* stroe result */
        _mm_storel_epi64((__m128i*)(src - inc), _mm_packus_epi16(TL0, c_0));
        _mm_storel_epi64((__m128i*)(src - 0), _mm_packus_epi16(TR0, c_0));

        _mm_storel_epi64((__m128i*)(src - inc2), _mm_packus_epi16(TL1, c_0));
        _mm_storel_epi64((__m128i*)(src + inc), _mm_packus_epi16(TR1, c_0));
    }

}